

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Fraction * __thiscall Matrix::At(Matrix *this,int i,int j)

{
  reference this_00;
  reference pvVar1;
  int j_local;
  int i_local;
  Matrix *this_local;
  
  this_00 = std::
            vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
            ::at(&this->elements_,(long)i);
  pvVar1 = std::vector<Fraction,_std::allocator<Fraction>_>::at(this_00,(long)j);
  return pvVar1;
}

Assistant:

Fraction& Matrix::At(int i, int j) {
  return elements_.at(i).at(j);
}